

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr deqp::TestSubcase::Create<glcts::AdvancedUsageSwitchPrograms>(void)

{
  AdvancedUsageSwitchPrograms *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (AdvancedUsageSwitchPrograms *)operator_new(0x80);
  (this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0
  ;
  (this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl =
       (Functions *)0x0;
  (this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log =
       (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_enableLog
       = 0;
  (this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0;
  this->counter_buffer_[0] = 0;
  this->counter_buffer_[1] = 0;
  this->counter_buffer_[2] = 0;
  this->counter_buffer_[3] = 0;
  this->counter_buffer_[4] = 0;
  this->counter_buffer_[5] = 0;
  this->counter_buffer_[6] = 0;
  this->counter_buffer_[7] = 0;
  this->xfb_buffer_ = 0;
  this->vao_ = 0;
  this->vbo_ = 0;
  this->prog_[0] = 0;
  this->prog_[1] = 0;
  this->prog_[2] = 0;
  this->prog_[3] = 0;
  this->prog_[4] = 0;
  this->prog_[5] = 0;
  this->prog_[6] = 0;
  *(undefined8 *)(this->prog_ + 7) = 0;
  *(undefined8 *)&this->rt_ = 0;
  glcts::AdvancedUsageSwitchPrograms::AdvancedUsageSwitchPrograms(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}